

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::Clara::CommandLine<Catch::ConfigData>::Arg::~Arg(Arg *this)

{
  OptionArgProperties::~OptionArgProperties(&this->super_OptionArgProperties);
  CommonArgProperties<Catch::ConfigData>::~CommonArgProperties
            (&this->super_CommonArgProperties<Catch::ConfigData>);
  return;
}

Assistant:

Arg() {}